

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O2

py_func_sig_info
boost::python::detail::caller_arity<2U>::
impl<bool_(AbstractModuleClient::*)(StimulationCommand),_boost::python::default_call_policies,_boost::mpl::vector3<bool,_AbstractModuleClient_&,_StimulationCommand>_>
::signature(void)

{
  int iVar1;
  char *raw_name;
  py_func_sig_info pVar2;
  
  pVar2.signature =
       signature_arity<2U>::
       impl<boost::mpl::vector3<bool,_AbstractModuleClient_&,_StimulationCommand>_>::elements();
  if (caller_arity<2u>::
      impl<bool(AbstractModuleClient::*)(StimulationCommand),boost::python::default_call_policies,boost::mpl::vector3<bool,AbstractModuleClient&,StimulationCommand>>
      ::signature()::ret == '\0') {
    iVar1 = __cxa_guard_acquire(&caller_arity<2u>::
                                 impl<bool(AbstractModuleClient::*)(StimulationCommand),boost::python::default_call_policies,boost::mpl::vector3<bool,AbstractModuleClient&,StimulationCommand>>
                                 ::signature()::ret);
    if (iVar1 != 0) {
      signature::ret.basename =
           (char *)gcc_demangle(_PyNumber_Multiply + (*_PyNumber_Multiply == '*'));
      signature::ret.pytype_f =
           converter_target_type<boost::python::to_python_value<const_bool_&>_>::get_pytype;
      signature::ret.lvalue = false;
      __cxa_guard_release(&caller_arity<2u>::
                           impl<bool(AbstractModuleClient::*)(StimulationCommand),boost::python::default_call_policies,boost::mpl::vector3<bool,AbstractModuleClient&,StimulationCommand>>
                           ::signature()::ret);
    }
  }
  pVar2.ret = &signature::ret;
  return pVar2;
}

Assistant:

static py_func_sig_info  signature()
        {
            const signature_element * sig = detail::signature<Sig>::elements();
#ifndef BOOST_PYTHON_NO_PY_SIGNATURES

            typedef BOOST_DEDUCED_TYPENAME Policies::template extract_return_type<Sig>::type rtype;
            typedef typename select_result_converter<Policies, rtype>::type result_converter;

            static const signature_element ret = {
                (is_void<rtype>::value ? "void" : type_id<rtype>().name())
                , &detail::converter_target_type<result_converter>::get_pytype
                , boost::detail::indirect_traits::is_reference_to_non_const<rtype>::value 
            };
            py_func_sig_info res = {sig, &ret };
#else
            py_func_sig_info res = {sig, sig };
#endif

            return  res;
        }